

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyLoop::~IfcPolyLoop(IfcPolyLoop *this)

{
  void *pvVar1;
  
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPolyLoop_0085ccd0;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPolyLoop_0085cd70;
  *(undefined ***)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcPolyLoop_0085ccf8;
  *(undefined ***)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcPolyLoop_0085cd20;
  *(undefined ***)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30 =
       &PTR__IfcPolyLoop_0085cd48;
  pvVar1 = *(void **)&(this->super_IfcLoop).field_0x40;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x50 - (long)pvVar1);
    return;
  }
  return;
}

Assistant:

IfcPolyLoop() : Object("IfcPolyLoop") {}